

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_algorithm.cpp
# Opt level: O3

void try_list_remove(void)

{
  ostream *poVar1;
  long *plVar2;
  list<int,std::allocator<int>> *plVar3;
  _List_node_base *p_Var4;
  list<int,_std::allocator<int>_> lb;
  list<int,_std::allocator<int>_> la;
  int arr [10];
  undefined4 local_94;
  list<int,_std::allocator<int>_> local_90;
  list<int,std::allocator<int>> *local_78 [3];
  const_iterator local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_48 = 0x800000009;
  uStack_40 = 0x400000006;
  local_58 = 0x300000001;
  uStack_50 = 0x700000005;
  local_38 = 2;
  std::__cxx11::list<int,std::allocator<int>>::list<int*,void>
            ((list<int,std::allocator<int>> *)local_78,(int *)&local_58,
             (int *)&stack0xffffffffffffffd0,(allocator_type *)&local_90);
  std::__cxx11::list<int,_std::allocator<int>_>::list
            (&local_90,(list<int,_std::allocator<int>_> *)local_78);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Original list:\nla:\t",0x13);
  if (local_78[0] != (list<int,std::allocator<int>> *)local_78) {
    plVar3 = local_78[0];
    do {
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*(int *)(plVar3 + 0x10));
      local_94 = CONCAT31(local_94._1_3_,0x20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_94,1);
      plVar3 = *(list<int,std::allocator<int>> **)plVar3;
    } while (plVar3 != (list<int,std::allocator<int>> *)local_78);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  local_94 = 4;
  std::__cxx11::list<int,_std::allocator<int>_>::remove
            ((list<int,_std::allocator<int>_> *)local_78,(char *)&local_94);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"After remove through member function remove():\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"la:\t",4);
  if (local_78[0] != (list<int,std::allocator<int>> *)local_78) {
    plVar3 = local_78[0];
    do {
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*(int *)(plVar3 + 0x10));
      local_94 = CONCAT31(local_94._1_3_,0x20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_94,1);
      plVar3 = *(list<int,std::allocator<int>> **)plVar3;
    } while (plVar3 != (list<int,std::allocator<int>> *)local_78);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  local_94 = 1;
  local_60._M_node =
       (_List_node_base *)
       std::__remove_if<std::_List_iterator<int>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                 (local_90.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                  super__List_node_base._M_next,(_List_node_base *)&local_90,
                  (_Iter_equals_val<const_int>)&local_94);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"After remove through STL function remove():\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"lb:\t",4);
  if (local_90.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
      _M_next != (_List_node_base *)&local_90) {
    p_Var4 = local_90.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
             super__List_node_base._M_next;
    do {
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*(int *)&p_Var4[1]._M_next);
      local_94 = CONCAT31(local_94._1_3_,0x20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_94,1);
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)&local_90);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__cxx11::list<int,_std::allocator<int>_>::erase(&local_90,local_60,(const_iterator)&local_90)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"After erase:\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"lb:\t",4);
  if (local_90.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
      _M_next != (_List_node_base *)&local_90) {
    p_Var4 = local_90.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
             super__List_node_base._M_next;
    do {
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*(int *)&p_Var4[1]._M_next);
      local_94 = CONCAT31(local_94._1_3_,0x20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_94,1);
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)&local_90);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  while (local_90.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
         _M_next != (_List_node_base *)&local_90) {
    p_Var4 = (local_90.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
              super__List_node_base._M_next)->_M_next;
    operator_delete(local_90.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                    super__List_node_base._M_next);
    local_90.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
    _M_next = p_Var4;
  }
  while (local_78[0] != (list<int,std::allocator<int>> *)local_78) {
    plVar3 = *(list<int,std::allocator<int>> **)local_78[0];
    operator_delete(local_78[0]);
    local_78[0] = plVar3;
  }
  return;
}

Assistant:

void try_list_remove()  {
    using namespace std;

    const int LIMIT = 10;
    int arr[LIMIT] = {1, 3, 5, 7, 9, 8, 6, 4, 2, 0};
    list<int> la(arr, arr + LIMIT);
    list<int> lb(la);

    cout << "Original list:\nla:\t";
    for_each(la.begin(), la.end(), showInt);
    cout << endl;

    //  member function will adjust size automatically
    la.remove(4);
    cout << "After remove through member function remove():\n";
    cout << "la:\t";
    for_each(la.begin(), la.end(), showInt);
    cout << endl << endl;

    list<int>::iterator last;
    //  STL remove won't adjust size
    //  FIXME: seems remove 0 not working?
    last = remove(lb.begin(), lb.end(), 1);
    cout << "After remove through STL function remove():\n";
    cout << "lb:\t";
    for_each(lb.begin(), lb.end(), showInt);
    cout << endl << endl;

    //  delete a range
    lb.erase(last, lb.end());
    cout << "After erase:\n";
    cout << "lb:\t";
    for_each(lb.begin(), lb.end(), showInt);
    cout << endl << endl;
}